

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O1

void __thiscall flow::IRHandler::moveBefore(IRHandler *this,BasicBlock *moveable,BasicBlock *before)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator __position;
  
  if ((moveable->handler_ == this) && (before->handler_ == this)) {
    this_00 = &this->blocks_;
    for (__position._M_node =
              (this->blocks_).
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
        (__position._M_node != (_List_node_base *)this_00 &&
        ((BasicBlock *)__position._M_node[1]._M_next != moveable));
        __position._M_node = (__position._M_node)->_M_next) {
    }
    p_Var2 = __position._M_node[1]._M_next;
    __position._M_node[1]._M_next = (_List_node_base *)0x0;
    std::__cxx11::
    list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
    ::_M_erase(this_00,__position);
    for (p_Var3 = (this_00->
                  super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        (p_Var3 != (_List_node_base *)this_00 && ((BasicBlock *)p_Var3[1]._M_next != before));
        p_Var3 = p_Var3->_M_next) {
    }
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->blocks_).
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("moveable->getHandler() == this && before->getHandler() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                ,0x68,"void flow::IRHandler::moveBefore(const BasicBlock *, const BasicBlock *)");
}

Assistant:

void IRHandler::moveBefore(const BasicBlock* moveable, const BasicBlock* before) {
  assert(moveable->getHandler() == this && before->getHandler() == this);

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == moveable; });
  std::unique_ptr<BasicBlock> m = std::move(*i);
  blocks_.erase(i);

  i = std::find_if(blocks_.begin(), blocks_.end(),
                   [&](const auto& obj) { return obj.get() == before; });
  ++i;
  blocks_.insert(i, std::move(m));
}